

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool GetTypeConstructorFunctions
               (ExpressionContext *ctx,TypeBase *type,bool noArguments,
               SmallArray<FunctionData_*,_32U> *functions)

{
  FunctionData *pFVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  TypeGenericClassProto *pTVar10;
  bool bVar11;
  uint uVar12;
  TypeClass *classType;
  InplaceStr IVar13;
  ArrayView<FunctionData_*> functions_00;
  ArrayView<FunctionData_*> functions_01;
  ArrayView<FunctionData_*> functions_02;
  ArrayView<FunctionData_*> functions_03;
  FunctionLookupChain chain;
  FunctionLookupChain local_78;
  TypeGenericClassProto *local_60;
  ExpressionContext *local_58;
  FunctionLookupChain local_50;
  uint local_34;
  
  if ((type == (TypeBase *)0x0) || (classType = (TypeClass *)type, type->typeID != 0x18)) {
    classType = (TypeClass *)0x0;
  }
  if ((type == (TypeBase *)0x0) || (local_60 = (TypeGenericClassProto *)type, type->typeID != 0x16))
  {
    local_60 = (TypeGenericClassProto *)0x0;
  }
  if ((classType != (TypeClass *)0x0) && (classType->proto != (TypeGenericClassProto *)0x0)) {
    local_60 = classType->proto;
  }
  local_58 = ctx;
  uVar12 = NULLC::StringHashContinue(type->nameHash,"::");
  if (classType == (TypeClass *)0x0) {
    IVar13 = type->name;
  }
  else {
    IVar13 = GetTypeConstructorName(classType);
  }
  local_34 = NULLC::StringHashContinue(uVar12,IVar13.begin,IVar13.end);
  anon_unknown.dwarf_11255e::LookupFunctionChainByName(&local_78,local_58,local_34);
  pTVar10 = local_60;
  while (local_60 = pTVar10, local_78.node.node != (Node *)0x0) {
    if ((((!noArguments) || (*(int *)(*(long *)(local_78.node.node + 0x10) + 0x78) == 0)) ||
        (*(long *)(*(long *)(*(long *)(local_78.node.node + 0x10) + 0x70) + 0x20) != 0)) &&
       (pFVar1 = *(FunctionData **)(local_78.node.node + 0x10), pFVar1->scope->ownerType == type)) {
      uVar12 = functions->count;
      uVar2 = functions->data;
      uVar3 = functions->count;
      functions_00.count = uVar3;
      functions_00.data = (FunctionData **)uVar2;
      functions_00._12_4_ = 0;
      bVar11 = ContainsSameOverload(functions_00,pFVar1);
      if (!bVar11) {
        if (uVar12 == functions->max) {
          SmallArray<FunctionData_*,_32U>::grow(functions,uVar12);
        }
        if (functions->data == (FunctionData **)0x0) goto LAB_001fc029;
        uVar12 = functions->count;
        functions->count = uVar12 + 1;
        functions->data[uVar12] = pFVar1;
      }
    }
    anon_unknown.dwarf_11255e::FunctionLookupChain::next(&local_50,&local_78);
    pTVar10 = local_60;
    local_78.node.node = local_50.node.node;
  }
  if (pTVar10 != (TypeGenericClassProto *)0x0) {
    uVar12 = NULLC::StringHashContinue((pTVar10->super_TypeBase).nameHash,"::");
    IVar13 = GetTypeConstructorName((pTVar10->super_TypeBase).name);
    uVar12 = NULLC::StringHashContinue(uVar12,IVar13.begin,IVar13.end);
    anon_unknown.dwarf_11255e::LookupFunctionChainByName(&local_78,local_58,uVar12);
    while (local_78.node.node != (Node *)0x0) {
      if (((!noArguments) || (*(int *)(*(long *)(local_78.node.node + 0x10) + 0x78) == 0)) ||
         (*(long *)(*(long *)(*(long *)(local_78.node.node + 0x10) + 0x70) + 0x20) != 0)) {
        uVar12 = functions->count;
        uVar4 = functions->data;
        uVar5 = functions->count;
        functions_01.count = uVar5;
        functions_01.data = (FunctionData **)uVar4;
        pFVar1 = *(FunctionData **)(local_78.node.node + 0x10);
        functions_01._12_4_ = 0;
        bVar11 = ContainsSameOverload(functions_01,pFVar1);
        if (!bVar11) {
          if (uVar12 == functions->max) {
            SmallArray<FunctionData_*,_32U>::grow(functions,uVar12);
          }
          if (functions->data == (FunctionData **)0x0) goto LAB_001fc029;
          uVar12 = functions->count;
          functions->count = uVar12 + 1;
          functions->data[uVar12] = pFVar1;
        }
      }
      anon_unknown.dwarf_11255e::FunctionLookupChain::next(&local_50,&local_78);
      local_78.node.node = local_50.node.node;
    }
  }
  uVar12 = NULLC::StringHashContinue(local_34,"$");
  anon_unknown.dwarf_11255e::LookupFunctionChainByName(&local_78,local_58,uVar12);
  pTVar10 = local_60;
  while (local_60 = pTVar10, local_78.node.node != (Node *)0x0) {
    if ((((!noArguments) || (*(int *)(*(long *)(local_78.node.node + 0x10) + 0x78) == 0)) ||
        (*(long *)(*(long *)(*(long *)(local_78.node.node + 0x10) + 0x70) + 0x20) != 0)) &&
       (pFVar1 = *(FunctionData **)(local_78.node.node + 0x10), pFVar1->scope->ownerType == type)) {
      uVar12 = functions->count;
      uVar6 = functions->data;
      uVar7 = functions->count;
      functions_02.count = uVar7;
      functions_02.data = (FunctionData **)uVar6;
      functions_02._12_4_ = 0;
      bVar11 = ContainsSameOverload(functions_02,pFVar1);
      if (!bVar11) {
        if (uVar12 == functions->max) {
          SmallArray<FunctionData_*,_32U>::grow(functions,uVar12);
        }
        if (functions->data == (FunctionData **)0x0) goto LAB_001fc029;
        uVar12 = functions->count;
        functions->count = uVar12 + 1;
        functions->data[uVar12] = pFVar1;
      }
    }
    anon_unknown.dwarf_11255e::FunctionLookupChain::next(&local_50,&local_78);
    pTVar10 = local_60;
    local_78.node.node = local_50.node.node;
  }
  if (pTVar10 != (TypeGenericClassProto *)0x0) {
    uVar12 = NULLC::StringHashContinue((pTVar10->super_TypeBase).nameHash,"::");
    IVar13 = GetTypeConstructorName((pTVar10->super_TypeBase).name);
    uVar12 = NULLC::StringHashContinue(uVar12,IVar13.begin,IVar13.end);
    uVar12 = NULLC::StringHashContinue(uVar12,"$");
    anon_unknown.dwarf_11255e::LookupFunctionChainByName(&local_78,local_58,uVar12);
    if (local_78.node.node != (Node *)0x0) {
      do {
        if (((!noArguments) || (*(int *)(*(long *)(local_78.node.node + 0x10) + 0x78) == 0)) ||
           (*(long *)(*(long *)(*(long *)(local_78.node.node + 0x10) + 0x70) + 0x20) != 0)) {
          uVar12 = functions->count;
          uVar8 = functions->data;
          uVar9 = functions->count;
          functions_03.count = uVar9;
          functions_03.data = (FunctionData **)uVar8;
          pFVar1 = *(FunctionData **)(local_78.node.node + 0x10);
          functions_03._12_4_ = 0;
          bVar11 = ContainsSameOverload(functions_03,pFVar1);
          if (!bVar11) {
            if (uVar12 == functions->max) {
              SmallArray<FunctionData_*,_32U>::grow(functions,uVar12);
            }
            if (functions->data == (FunctionData **)0x0) {
LAB_001fc029:
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,
                            "void SmallArray<FunctionData *, 32>::push_back(const T &) [T = FunctionData *, N = 32]"
                           );
            }
            uVar12 = functions->count;
            functions->count = uVar12 + 1;
            functions->data[uVar12] = pFVar1;
          }
        }
        anon_unknown.dwarf_11255e::FunctionLookupChain::next(&local_50,&local_78);
        local_78.node.node = local_50.node.node;
      } while (local_50.node.node != (Node *)0x0);
    }
  }
  return functions->count != 0;
}

Assistant:

bool GetTypeConstructorFunctions(ExpressionContext &ctx, TypeBase *type, bool noArguments, SmallArray<FunctionData*, 32> &functions)
{
	TypeClass *classType = getType<TypeClass>(type);
	TypeGenericClassProto *typeGenericClassProto = getType<TypeGenericClassProto>(type);

	if(classType && classType->proto)
		typeGenericClassProto = classType->proto;

	unsigned hash = NULLC::StringHashContinue(type->nameHash, "::");

	if(classType)
	{
		InplaceStr functionName = GetTypeConstructorName(classType);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);
	}
	else
	{
		hash = NULLC::StringHashContinue(hash, type->name.begin, type->name.end);
	}

	for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, hash); chain; chain = chain.next())
	{
		if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
			continue;

		if(chain->scope->ownerType != type)
			continue;

		if(!ContainsSameOverload(functions, *chain))
			functions.push_back(*chain);
	}

	if(typeGenericClassProto)
	{
		// Look for a member function in a generic class base and instantiate them
		unsigned hash = NULLC::StringHashContinue(typeGenericClassProto->nameHash, "::");

		InplaceStr functionName = GetTypeConstructorName(typeGenericClassProto);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, hash); chain; chain = chain.next())
		{
			if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
				continue;

			if(!ContainsSameOverload(functions, *chain))
				functions.push_back(*chain);
		}
	}

	for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, NULLC::StringHashContinue(hash, "$")); chain; chain = chain.next())
	{
		if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
			continue;

		if(chain->scope->ownerType != type)
			continue;

		if(!ContainsSameOverload(functions, *chain))
			functions.push_back(*chain);
	}

	if(typeGenericClassProto)
	{
		// Look for a member function in a generic class base and instantiate them
		unsigned hash = NULLC::StringHashContinue(typeGenericClassProto->nameHash, "::");

		InplaceStr functionName = GetTypeConstructorName(typeGenericClassProto);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, NULLC::StringHashContinue(hash, "$")); chain; chain = chain.next())
		{
			if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
				continue;

			if(!ContainsSameOverload(functions, *chain))
				functions.push_back(*chain);
		}
	}

	return !functions.empty();
}